

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool testing::internal::ShouldUseColor(bool stdout_is_tty)

{
  bool bVar1;
  bool bVar2;
  char *lhs;
  string c;
  char *local_38 [4];
  
  std::__cxx11::string::string
            ((string *)local_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             FLAGS_gtest_color_abi_cxx11_);
  bVar1 = String::CaseInsensitiveCStringEquals(local_38[0],"auto");
  if (bVar1) {
    lhs = getenv("TERM");
    bVar1 = String::CStringEquals(lhs,"xterm");
    bVar2 = true;
    if (!bVar1) {
      bVar1 = String::CStringEquals(lhs,"xterm-color");
      if (!bVar1) {
        bVar1 = String::CStringEquals(lhs,"xterm-256color");
        if (!bVar1) {
          bVar1 = String::CStringEquals(lhs,"screen");
          if (!bVar1) {
            bVar1 = String::CStringEquals(lhs,"screen-256color");
            if (!bVar1) {
              bVar1 = String::CStringEquals(lhs,"tmux");
              if (!bVar1) {
                bVar1 = String::CStringEquals(lhs,"tmux-256color");
                if (!bVar1) {
                  bVar1 = String::CStringEquals(lhs,"rxvt-unicode");
                  if (!bVar1) {
                    bVar1 = String::CStringEquals(lhs,"rxvt-unicode-256color");
                    if (!bVar1) {
                      bVar1 = String::CStringEquals(lhs,"linux");
                      if (!bVar1) {
                        bVar2 = String::CStringEquals(lhs,"cygwin");
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    bVar2 = (bool)(bVar2 & stdout_is_tty);
  }
  else {
    bVar1 = String::CaseInsensitiveCStringEquals(local_38[0],"yes");
    bVar2 = true;
    if (!bVar1) {
      bVar1 = String::CaseInsensitiveCStringEquals(local_38[0],"true");
      if (!bVar1) {
        bVar1 = String::CaseInsensitiveCStringEquals(local_38[0],"t");
        if (!bVar1) {
          bVar2 = String::CStringEquals(local_38[0],"1");
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)local_38);
  return bVar2;
}

Assistant:

bool ShouldUseColor(bool stdout_is_tty) {
  std::string c = GTEST_FLAG_GET(color);
  const char* const gtest_color = c.c_str();

  if (String::CaseInsensitiveCStringEquals(gtest_color, "auto")) {
#if GTEST_OS_WINDOWS && !GTEST_OS_WINDOWS_MINGW
    // On Windows the TERM variable is usually not set, but the
    // console there does support colors.
    return stdout_is_tty;
#else
    // On non-Windows platforms, we rely on the TERM variable.
    const char* const term = posix::GetEnv("TERM");
    const bool term_supports_color =
        String::CStringEquals(term, "xterm") ||
        String::CStringEquals(term, "xterm-color") ||
        String::CStringEquals(term, "xterm-256color") ||
        String::CStringEquals(term, "screen") ||
        String::CStringEquals(term, "screen-256color") ||
        String::CStringEquals(term, "tmux") ||
        String::CStringEquals(term, "tmux-256color") ||
        String::CStringEquals(term, "rxvt-unicode") ||
        String::CStringEquals(term, "rxvt-unicode-256color") ||
        String::CStringEquals(term, "linux") ||
        String::CStringEquals(term, "cygwin");
    return stdout_is_tty && term_supports_color;
#endif  // GTEST_OS_WINDOWS
  }

  return String::CaseInsensitiveCStringEquals(gtest_color, "yes") ||
      String::CaseInsensitiveCStringEquals(gtest_color, "true") ||
      String::CaseInsensitiveCStringEquals(gtest_color, "t") ||
      String::CStringEquals(gtest_color, "1");
  // We take "yes", "true", "t", and "1" as meaning "yes".  If the
  // value is neither one of these nor "auto", we treat it as "no" to
  // be conservative.
}